

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCnf.c
# Opt level: O0

void Sfm_TranslateCnf(Vec_Wec_t *vRes,Vec_Str_t *vCnf,Vec_Int_t *vFaninMap,int iPivotVar)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int *pMap;
  undefined4 local_38;
  int Lit;
  int i;
  char Entry;
  Vec_Int_t *vClause;
  int iPivotVar_local;
  Vec_Int_t *vFaninMap_local;
  Vec_Str_t *vCnf_local;
  Vec_Wec_t *vRes_local;
  
  Vec_WecClear(vRes);
  _i = Vec_WecPushLevel(vRes);
  for (local_38 = 0; iVar2 = Vec_StrSize(vCnf), local_38 < iVar2; local_38 = local_38 + 1) {
    cVar1 = Vec_StrEntry(vCnf,local_38);
    if (cVar1 == -1) {
      _i = Vec_WecPushLevel(vRes);
    }
    else {
      pMap = Vec_IntArray(vFaninMap);
      iVar2 = Abc_Lit2LitV(pMap,(int)cVar1);
      iVar3 = Abc_Lit2Var(iVar2);
      iVar2 = Abc_LitNotCond(iVar2,(uint)(iVar3 == iPivotVar));
      Vec_IntPush(_i,iVar2);
    }
  }
  return;
}

Assistant:

void Sfm_TranslateCnf( Vec_Wec_t * vRes, Vec_Str_t * vCnf, Vec_Int_t * vFaninMap, int iPivotVar )
{
    Vec_Int_t * vClause;
    char Entry;
    int i, Lit;
    Vec_WecClear( vRes );
    vClause = Vec_WecPushLevel( vRes );
    Vec_StrForEachEntry( vCnf, Entry, i )
    {
        if ( (int)Entry == -1 )
        {
            vClause = Vec_WecPushLevel( vRes );
            continue;
        }
        Lit = Abc_Lit2LitV( Vec_IntArray(vFaninMap), (int)Entry );
        Lit = Abc_LitNotCond( Lit, Abc_Lit2Var(Lit) == iPivotVar );
        Vec_IntPush( vClause, Lit );
    }
}